

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::status_internal::StatusRep::operator==(StatusRep *this,StatusRep *other)

{
  size_t sVar1;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *pSVar2;
  Storage<unsigned_long,_1UL,_false> SVar3;
  Cord *pCVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *pSVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *pSVar12;
  Payload *payload;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *pSVar13;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar14;
  ulong uVar15;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar20;
  Cord *pCVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  Payloads no_payloads;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  local_68;
  
  if (this == other) {
    __assert_fail("this != &other",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/status/internal/status_internal.cc"
                  ,0x9d,"bool absl::status_internal::StatusRep::operator==(const StatusRep &) const"
                 );
  }
  if (((this->code_ == other->code_) &&
      (sVar1 = (this->message_)._M_string_length, sVar1 == (other->message_)._M_string_length)) &&
     ((sVar1 == 0 ||
      (iVar6 = bcmp((this->message_)._M_dataplus._M_p,(other->message_)._M_dataplus._M_p,sVar1),
      iVar6 == 0)))) {
    pSVar8 = &((this->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    pSVar2 = &((other->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    if (pSVar8 == (Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                   *)0x0) {
      pSVar8 = &local_68;
    }
    pSVar12 = pSVar2;
    if (pSVar2 == (Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                   *)0x0) {
      pSVar12 = &local_68;
    }
    local_68.metadata_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          )(Storage<unsigned_long,_1UL,_false>)0x0;
    uVar11 = (pSVar8->metadata_).
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
             .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar10 = uVar11 >> 1;
    uVar9 = (pSVar12->metadata_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar15 = uVar9 >> 1;
    if (uVar10 < uVar15) {
      uVar11 = uVar9;
      pSVar12 = pSVar8;
    }
    if ((uVar11 >> 1) -
        ((pSVar12->metadata_).
         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value >> 1) < 2) {
      pSVar13 = pSVar2;
      if (pSVar2 == (Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                     *)0x0) {
        pSVar13 = &local_68;
      }
      if (uVar15 <= uVar10) {
        pSVar13 = pSVar8;
      }
      if ((uVar11 & 1) == 0) {
        pPVar14 = (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
                  &pSVar13->data_;
      }
      else {
        pPVar14 = (pSVar13->data_).allocated.allocated_data;
      }
      bVar23 = uVar11 < 2;
      if (!bVar23) {
        pPVar16 = pPVar14 + (uVar11 >> 1);
        pSVar13 = &local_68;
        if (pSVar2 != (Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                       *)0x0) {
          pSVar13 = pSVar2;
        }
        if (uVar10 < uVar15) {
          pSVar13 = pSVar8;
        }
        do {
          SVar3.value = (pSVar12->metadata_).
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                        .super_Storage<unsigned_long,_1UL,_false>.value;
          pPVar20 = (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
                    &pSVar13->data_;
          if ((SVar3.value & 1) != 0) {
            pPVar20 = (pSVar13->data_).allocated.allocated_data;
          }
          if (SVar3.value < 2) {
            uVar22 = 4;
            uVar7 = 1;
          }
          else {
            pCVar4 = &pPVar14->payload;
            lVar17 = (SVar3.value >> 1) * 0x30;
            pCVar21 = &pPVar20->payload;
            bVar18 = 0;
            bVar19 = 0;
            do {
              sVar1 = (pPVar14->type_url)._M_string_length;
              uVar22 = 0;
              bVar24 = false;
              if (sVar1 == (((Payload *)(pCVar21 + -2))->type_url)._M_string_length) {
                if (sVar1 == 0) {
                  bVar24 = true;
                }
                else {
                  iVar6 = bcmp((pPVar14->type_url)._M_dataplus._M_p,
                               (((Payload *)(pCVar21 + -2))->type_url)._M_dataplus._M_p,sVar1);
                  bVar24 = iVar6 == 0;
                }
              }
              if (bVar24) {
                auVar25[0] = -((pCVar21->contents_).data_.rep_.field_0.data[0] ==
                              (pCVar4->contents_).data_.rep_.field_0.data[0]);
                auVar25[1] = -((pCVar21->contents_).data_.rep_.field_0.data[1] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[1]);
                auVar25[2] = -((pCVar21->contents_).data_.rep_.field_0.data[2] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[2]);
                auVar25[3] = -((pCVar21->contents_).data_.rep_.field_0.data[3] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[3]);
                auVar25[4] = -((pCVar21->contents_).data_.rep_.field_0.data[4] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[4]);
                auVar25[5] = -((pCVar21->contents_).data_.rep_.field_0.data[5] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[5]);
                auVar25[6] = -((pCVar21->contents_).data_.rep_.field_0.data[6] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[6]);
                auVar25[7] = -((pCVar21->contents_).data_.rep_.field_0.data[7] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[7]);
                auVar25[8] = -((pCVar21->contents_).data_.rep_.field_0.data[8] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[8]);
                auVar25[9] = -((pCVar21->contents_).data_.rep_.field_0.data[9] ==
                              (pPVar14->payload).contents_.data_.rep_.field_0.data[9]);
                auVar25[10] = -((pCVar21->contents_).data_.rep_.field_0.data[10] ==
                               (pPVar14->payload).contents_.data_.rep_.field_0.data[10]);
                auVar25[0xb] = -((pCVar21->contents_).data_.rep_.field_0.data[0xb] ==
                                (pPVar14->payload).contents_.data_.rep_.field_0.data[0xb]);
                auVar25[0xc] = -((pCVar21->contents_).data_.rep_.field_0.data[0xc] ==
                                (pPVar14->payload).contents_.data_.rep_.field_0.data[0xc]);
                auVar25[0xd] = -((pCVar21->contents_).data_.rep_.field_0.data[0xd] ==
                                (pPVar14->payload).contents_.data_.rep_.field_0.data[0xd]);
                auVar25[0xe] = -((pCVar21->contents_).data_.rep_.field_0.data[0xe] ==
                                (pPVar14->payload).contents_.data_.rep_.field_0.data[0xe]);
                auVar25[0xf] = -((pCVar21->contents_).data_.rep_.field_0.data[0xf] ==
                                (pPVar14->payload).contents_.data_.rep_.field_0.data[0xf]);
                if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
                  bVar5 = 0;
                }
                else {
                  uVar11 = (ulong)(pCVar21->contents_).data_.rep_.field_0.data[0];
                  if ((uVar11 & 1) == 0) {
                    uVar11 = uVar11 >> 1;
                  }
                  else {
                    uVar11 = ((pCVar21->contents_).data_.rep_.field_0.as_tree.rep)->length;
                  }
                  uVar9 = (ulong)(pCVar4->contents_).data_.rep_.field_0.data[0];
                  if ((uVar9 & 1) == 0) {
                    uVar9 = uVar9 >> 1;
                  }
                  else {
                    uVar9 = ((pPVar14->payload).contents_.data_.rep_.field_0.as_tree.rep)->length;
                  }
                  bVar5 = 1;
                  if (uVar9 == uVar11) {
                    bVar5 = absl::lts_20240722::Cord::EqualsImpl(pCVar4,(ulong)pCVar21);
                    bVar5 = bVar5 ^ 1;
                  }
                }
                bVar19 = bVar18;
                if (bVar5 == 0) {
                  bVar19 = 1;
                }
                uVar22 = (uint)(bVar5 ^ 1) + (uint)(bVar5 ^ 1) * 2 + 1;
                bVar18 = bVar19;
              }
              if (bVar24) goto LAB_00105dcd;
              pCVar21 = pCVar21 + 3;
              lVar17 = lVar17 + -0x30;
            } while (lVar17 != 0);
            uVar22 = 4;
LAB_00105dcd:
            uVar7 = (uint)(~bVar19 & 1);
          }
          if (uVar22 != 4) {
            uVar7 = uVar22;
          }
          if (uVar7 != 0) break;
          pPVar14 = pPVar14 + 1;
          bVar23 = pPVar14 == pPVar16;
        } while (!bVar23);
      }
    }
    else {
      bVar23 = false;
    }
    inlined_vector_internal::
    Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
    ::~Storage(&local_68);
  }
  else {
    bVar23 = false;
  }
  return bVar23;
}

Assistant:

bool StatusRep::operator==(const StatusRep& other) const {
  assert(this != &other);
  if (code_ != other.code_) return false;
  if (message_ != other.message_) return false;
  const status_internal::Payloads* this_payloads = payloads_.get();
  const status_internal::Payloads* other_payloads = other.payloads_.get();

  const status_internal::Payloads no_payloads;
  const status_internal::Payloads* larger_payloads =
      this_payloads ? this_payloads : &no_payloads;
  const status_internal::Payloads* smaller_payloads =
      other_payloads ? other_payloads : &no_payloads;
  if (larger_payloads->size() < smaller_payloads->size()) {
    std::swap(larger_payloads, smaller_payloads);
  }
  if ((larger_payloads->size() - smaller_payloads->size()) > 1) return false;
  // Payloads can be ordered differently, so we can't just compare payload
  // vectors.
  for (const auto& payload : *larger_payloads) {

    bool found = false;
    for (const auto& other_payload : *smaller_payloads) {
      if (payload.type_url == other_payload.type_url) {
        if (payload.payload != other_payload.payload) {
          return false;
        }
        found = true;
        break;
      }
    }
    if (!found) return false;
  }
  return true;
}